

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_short_sample(poly *out,uint8_t *in)

{
  uint16_t uVar1;
  ulong uStack_20;
  uint16_t v;
  size_t i;
  uint8_t *in_local;
  poly *out_local;
  
  for (uStack_20 = 0; uStack_20 < 700; uStack_20 = uStack_20 + 1) {
    uVar1 = mod3((ushort)in[uStack_20]);
    (out->field_0).v[uStack_20] = uVar1 | ((ushort)((int)(uint)uVar1 >> 1) ^ 1) - 1;
  }
  (out->field_0).v[700] = 0;
  poly_normalize(out);
  return;
}

Assistant:

static void poly_short_sample(struct poly *out,
                              const uint8_t in[HRSS_SAMPLE_BYTES]) {
  static_assert(HRSS_SAMPLE_BYTES == N - 1, "HRSS_SAMPLE_BYTES incorrect");
  for (size_t i = 0; i < N - 1; i++) {
    uint16_t v = mod3(in[i]);
    // Map {0, 1, 2} -> {0, 1, 0xffff}
    v |= ((v >> 1) ^ 1) - 1;
    out->v[i] = v;
  }
  out->v[N - 1] = 0;
  poly_normalize(out);
}